

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvascan.c
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  nva_regspace_type nVar5;
  nva_err err;
  nva_err err_00;
  int iVar6;
  nva_err nVar7;
  int iVar8;
  int iVar9;
  int *piVar10;
  uint uVar11;
  char *__ptr;
  undefined4 uVar12;
  int iVar14;
  bool bVar15;
  bool bVar16;
  size_t sStack_b0;
  int32_t a;
  char local_9d;
  int local_9c;
  nva_regspace rs;
  int32_t b;
  uint64_t x;
  uint64_t z;
  uint local_58;
  undefined4 local_54;
  nva_err local_50;
  int local_4c;
  uint64_t y;
  uint64_t ch;
  uint64_t sv;
  undefined8 uVar13;
  
  iVar4 = nva_init();
  if (iVar4 != 0) {
    fwrite("PCI init failure!\n",0x12,1,_stderr);
    return 1;
  }
  rs.regsz = 0;
  rs.idx = 0;
  rs.card = (nva_card *)0x0;
  rs.cnum = 0;
  rs.type = NVA_REGSPACE_BAR0;
  local_9c = 0;
  bVar2 = false;
switchD_00102456_caseD_64:
  iVar4 = getopt(argc,argv,"asc:i:b:t:");
  switch(iVar4) {
  case 0x61:
    bVar2 = true;
    goto switchD_00102456_caseD_64;
  case 0x62:
    __isoc99_sscanf(_optarg,"%d",&rs.regsz);
    if ((8 < (uint)rs.regsz) || ((0x116U >> (rs.regsz & 0x1fU) & 1) == 0)) {
      __ptr = "Invalid size.\n";
      goto LAB_001029aa;
    }
    goto switchD_00102456_caseD_64;
  case 99:
    piVar10 = &rs.cnum;
    break;
  case 100:
  case 0x65:
  case 0x66:
  case 0x67:
  case 0x68:
    goto switchD_00102456_caseD_64;
  case 0x69:
    piVar10 = &rs.idx;
    break;
  default:
    if (iVar4 == 0x73) {
      local_9c = 1;
    }
    else {
      if (iVar4 != 0x74) goto code_r0x0010246b;
      nVar5 = nva_rstype(_optarg);
      rs.type = nVar5;
      if (nVar5 == NVA_REGSPACE_UNKNOWN) {
        __ptr = "Unknown register space.\n";
        sStack_b0 = 0x18;
        goto LAB_001029ac;
      }
    }
    goto switchD_00102456_caseD_64;
  }
  __isoc99_sscanf(_optarg,"%d",piVar10);
  goto switchD_00102456_caseD_64;
code_r0x0010246b:
  if (iVar4 == -1) {
    if (rs.cnum < nva_cardsnum) {
      rs.card = nva_cards[rs.cnum];
      if (rs.regsz == 0) {
        iVar4 = nva_rsdefsz(&rs);
        rs.regsz = iVar4;
      }
      local_4c = nva_rsunitsz(&rs);
      iVar4 = local_9c;
      b = rs.regsz / local_4c;
      if (_optind < argc) {
        __isoc99_sscanf(argv[_optind],"%x",&a);
        if (_optind + 1 < argc) {
          __isoc99_sscanf(argv[(long)_optind + 1],"%x",&b);
        }
        bVar1 = true;
        iVar14 = 0;
        local_9c = iVar4;
        do {
          if (b <= iVar14) {
            return 0;
          }
          err = nva_rd(&rs,a + iVar14,&x);
          uVar13 = 0;
          uVar12 = 0;
          err_00 = NVA_ERR_SUCCESS;
          bVar15 = false;
          nVar7 = NVA_ERR_SUCCESS;
          bVar16 = false;
          if (err == NVA_ERR_SUCCESS) {
            iVar4 = nva_wr(&rs,a + iVar14,0xffffffffffffffff);
            err_00 = nva_rd(&rs,a + iVar14,&y);
            iVar6 = nva_wr(&rs,a + iVar14,0);
            nVar7 = nva_rd(&rs,a + iVar14,&z);
            iVar8 = nva_wr(&rs,a + iVar14,x);
            bVar15 = iVar6 != 0;
            bVar16 = iVar8 != 0;
            uVar12 = (undefined4)
                     CONCAT71((int7)((ulong)uVar13 >> 8),(iVar4 != 0 || iVar6 != 0) || iVar8 != 0);
            iVar4 = local_9c;
          }
          if ((bool)(z != 0 | y != 0 | x != 0 | bVar15 | bVar16 |
                    (((err_00 != NVA_ERR_SUCCESS || nVar7 != NVA_ERR_SUCCESS) ||
                     err != NVA_ERR_SUCCESS) || err_00 != NVA_ERR_SUCCESS))) {
            if (err == NVA_ERR_SUCCESS) {
              local_9d = z != y || x != y;
              bVar1 = true;
              local_54 = uVar12;
              local_50 = nVar7;
              if (bVar2 && (z != y || x != y)) {
                nva_wr(&rs,a + iVar14,0xffffffffffffffff);
                iVar4 = 0;
                while( true ) {
                  bVar1 = iVar14 <= iVar4;
                  if (iVar14 <= iVar4) break;
                  iVar6 = nva_rd(&rs,a + iVar4,&sv);
                  if (iVar6 == 0) {
                    iVar6 = nva_wr(&rs,a + iVar4,0);
                    iVar8 = nva_rd(&rs,a + iVar14,&ch);
                    iVar9 = nva_wr(&rs,a + iVar4,sv);
                    if ((ch == z) && ((iVar8 == 0 && iVar6 == 0) && iVar9 == 0)) {
                      local_58 = iVar4 + a;
                      break;
                    }
                  }
                  iVar4 = iVar4 + 4;
                }
                nva_wr(&rs,a + iVar14,x);
                iVar4 = local_9c;
              }
              printf("%06x:");
              nva_rsprint(&rs,NVA_ERR_SUCCESS,x);
              nva_rsprint(&rs,err_00,y);
              nva_rsprint(&rs,local_50,z);
              if ((char)local_54 != '\0') {
                printf(" WERR");
              }
              if (local_9d != '\0') {
                printf(" *");
              }
              if (!bVar1) {
                printf(" ALIASES %06x",(ulong)local_58);
              }
              putchar(10);
              bVar1 = true;
            }
            else {
              uVar11 = a + iVar14;
              cVar3 = nva_rserrc(err);
              printf("%06x: %c\n",(ulong)uVar11,(ulong)(uint)(int)cVar3);
              bVar1 = true;
            }
          }
          else {
            if (bVar1) {
              puts("...");
            }
            bVar1 = false;
          }
          if (iVar4 != 0) {
            iVar6 = 100;
            do {
              bVar16 = iVar6 != 0;
              iVar6 = iVar6 + -1;
            } while (bVar16);
            usleep(10000);
            iVar6 = 100;
            do {
              bVar16 = iVar6 != 0;
              iVar6 = iVar6 + -1;
            } while (bVar16);
          }
          iVar14 = iVar14 + rs.regsz / local_4c;
        } while( true );
      }
      __ptr = "No address specified.\n";
      sStack_b0 = 0x16;
    }
    else if (nva_cardsnum == 0) {
      __ptr = "No cards found.\n";
      sStack_b0 = 0x10;
    }
    else {
      __ptr = "No such card.\n";
LAB_001029aa:
      sStack_b0 = 0xe;
    }
LAB_001029ac:
    fwrite(__ptr,sStack_b0,1,_stderr);
    return 1;
  }
  goto switchD_00102456_caseD_64;
}

Assistant:

int main(int argc, char **argv) {
	if (nva_init()) {
		fprintf (stderr, "PCI init failure!\n");
		return 1;
	}
	int alias = 0;
	int slow = 0;
	int c;
	struct nva_regspace rs = { 0 };
	while ((c = getopt (argc, argv, "asc:i:b:t:")) != -1)
		switch (c) {
			case 'a':
				alias = 1;
				break;
			case 's':
				slow = 1;
				break;
			case 'c':
				sscanf(optarg, "%d", &rs.cnum);
				break;
			case 'i':
				sscanf(optarg, "%d", &rs.idx);
				break;
			case 'b':
				sscanf(optarg, "%d", &rs.regsz);
				if (rs.regsz != 1 && rs.regsz != 2 && rs.regsz != 4 && rs.regsz != 8) {
					fprintf (stderr, "Invalid size.\n");
					return 1;
				}
				break;
			case 't':
				rs.type = nva_rstype(optarg);
				if (rs.type == NVA_REGSPACE_UNKNOWN) {
					fprintf (stderr, "Unknown register space.\n");
					return 1;
				}
				break;
		}
	if (rs.cnum >= nva_cardsnum) {
		if (nva_cardsnum)
			fprintf (stderr, "No such card.\n");
		else
			fprintf (stderr, "No cards found.\n");
		return 1;
	}
	rs.card = nva_cards[rs.cnum];
	if (rs.regsz == 0)
		rs.regsz = nva_rsdefsz(&rs);
	int unit = nva_rsunitsz(&rs);
	int32_t a, b = rs.regsz/unit, i;
	if (optind >= argc) {
		fprintf (stderr, "No address specified.\n");
		return 1;
	}
	sscanf (argv[optind], "%x", &a);
	if (optind + 1 < argc)
		sscanf (argv[optind + 1], "%x", &b);
	int ls = 1;
	for (i = 0; i < b; i+=rs.regsz/unit) {
		uint64_t x, y, z;
		int ex = nva_rd(&rs, a+i, &x);
		int ew = 0, ey = 0, ev = 0, ez = 0, eb = 0;
		if (!ex) {
			ew = nva_wr(&rs, a+i, -1ll);
			ey = nva_rd(&rs, a+i, &y);
			ev = nva_wr(&rs, a+i, 0);
			ez = nva_rd(&rs, a+i, &z);
			eb = nva_wr(&rs, a+i, x);
		}
		if (ex || ey || ez || ey || ev || eb || x || y || z) {
			if (ex) {
				printf ("%06x: %c\n", a+i, nva_rserrc(ex));
			} else {
				int cool = (x != y) || (y != z);
				int isalias = 0, areg;
				if (cool && alias) {
					int j;
					nva_wr(&rs, a+i, -1ll);
					for (j = 0; j < i; j+=4) {
						uint64_t sv;
						uint64_t ch;
						int es = nva_rd(&rs, a+j, &sv);
						if (!es) {
							es |= nva_wr(&rs, a+j, 0);
							es |= nva_rd(&rs, a+i, &ch);
							es |= nva_wr(&rs, a+j, sv);
							if (ch == z && !es) {
								areg = a + j;
								isalias = 1;
								break;
							}
						}
					}
					nva_wr(&rs, a+i, x);
				}
				printf ("%06x:", a+i);
				nva_rsprint(&rs, ex, x);
				nva_rsprint(&rs, ey, y);
				nva_rsprint(&rs, ez, z);
				if (ew || ev || eb)
					printf(" WERR");
				if (cool)
					printf(" *");
				if (isalias) {
					printf(" ALIASES %06x", areg);
				}
				printf("\n");
			}
			ls = 1;
		} else {
			if (ls)
				printf("...\n");
			ls = 0;
		}
		if (slow) {
			int j;
			for (j = 0; j < 100; j++)
				nva_rd32(rs.cnum, 0);
			usleep(10000);
			for (j = 0; j < 100; j++)
				nva_rd32(rs.cnum, 0);
		}
	}
	return 0;
}